

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void get_categs(size_t *ix_arr,int *x,size_t st,size_t end,int ncat,MissingAction missing_action,
               char *categs,size_t *npresent,bool *unsplittable)

{
  unsigned_long uVar1;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  long in_stack_00000008;
  size_t row;
  undefined8 in_stack_00000018;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  
  std::fill<signed_char*,int>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int *)0x1ad283);
  *(undefined8 *)row = 0;
  for (local_38 = in_RDX; local_38 <= in_RCX; local_38 = local_38 + 1) {
    if (-1 < *(int *)(in_RSI + *(long *)(in_RDI + local_38 * 8) * 4)) {
      *(undefined1 *)(in_stack_00000008 + *(int *)(in_RSI + *(long *)(in_RDI + local_38 * 8) * 4)) =
           1;
    }
  }
  uVar1 = std::
          accumulate<signed_char*,unsigned_long,get_categs(unsigned_long*,int*,unsigned_long,unsigned_long,int,MissingAction,signed_char*,unsigned_long&,bool&)::__0>
                    (in_stack_00000008,in_stack_00000008 + in_R8D,0);
  *(unsigned_long *)row = uVar1;
  *(bool *)in_stack_00000018 = *(ulong *)row < 2;
  return;
}

Assistant:

void get_categs(size_t *restrict ix_arr, int x[], size_t st, size_t end, int ncat,
                MissingAction missing_action, signed char categs[], size_t &restrict npresent, bool &unsplittable) noexcept
{
    std::fill(categs, categs + ncat, -1);
    npresent = 0;
    for (size_t row = st; row <= end; row++)
        if (likely(x[ix_arr[row]] >= 0))
            categs[x[ix_arr[row]]] = 1;

    npresent = std::accumulate(categs,
                               categs + ncat,
                               (size_t)0,
                               [](const size_t a, const signed char b){return a + (b > 0);}
                               );

    unsplittable = npresent < 2;
}